

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O2

void __thiscall
TPZCompElH1<pzshape::TPZShapeCube>::~TPZCompElH1
          (TPZCompElH1<pzshape::TPZShapeCube> *this,void **vtt)

{
  void *pvVar1;
  TPZGeoEl *pTVar2;
  TPZConnect *pTVar3;
  long lVar4;
  TPZStack<long,_10> connectlist;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).super_TPZInterpolatedElement.
             super_TPZInterpolationSpace.super_TPZCompEl = pvVar1;
  *(void **)((long)(this->fConnectIndexes).fExtAlloc + *(long *)((long)pvVar1 + -0x60) + -0x80) =
       vtt[9];
  pTVar2 = TPZCompEl::Reference((TPZCompEl *)this);
  if (pTVar2 != (TPZGeoEl *)0x0) {
    if ((TPZCompElH1<pzshape::TPZShapeCube> *)pTVar2->fReference == this) {
      (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                             super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                             super_TPZCompEl + 0x358))(this,1);
    }
    pTVar2 = TPZCompEl::Reference((TPZCompEl *)this);
    pTVar2->fReference = (TPZCompEl *)0x0;
  }
  TPZStack<long,_10>::TPZStack(&connectlist);
  (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                         super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl +
              0x1e0))(this,&connectlist);
  lVar4 = 0;
  if (connectlist.super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements < 1) {
    connectlist.super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements = lVar4;
  }
  for (; connectlist.super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements != lVar4;
      lVar4 = lVar4 + 1) {
    if (connectlist.super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[lVar4] != -1) {
      pTVar3 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(((this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                             super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                             super_TPZCompEl.fMesh)->fConnectVec).
                           super_TPZChunkVector<TPZConnect,_10>,
                          connectlist.super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[lVar4])
      ;
      pTVar3->fNElConnected = pTVar3->fNElConnected + -1;
    }
  }
  TPZManVector<long,_10>::~TPZManVector(&connectlist.super_TPZManVector<long,_10>);
  TPZManVector<long,_27>::~TPZManVector(&this->fConnectIndexes);
  TPZInterpolatedElement::~TPZInterpolatedElement((TPZInterpolatedElement *)this,vtt + 2);
  return;
}

Assistant:

TPZCompElH1<TSHAPE>::~TPZCompElH1() {
    TPZGeoEl *gel = this->Reference();
    if (gel) {
        TPZCompEl *cel = gel->Reference();
        if (cel == this) {
            this->RemoveSideRestraintsII(this->EDelete);
        }
        this->Reference()->ResetReference();
    }
    TPZStack<int64_t > connectlist;
    this->BuildConnectList(connectlist);
    int64_t nconnects = connectlist.size();
    for (int ic = 0; ic < nconnects; ic++) {
        if (connectlist[ic] != -1){
            this->fMesh->ConnectVec()[connectlist[ic]].DecrementElConnected();
        }
    }
}